

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

int __thiscall
Clasp::Cli::TextOutput::printChildKey(TextOutput *this,uint level,char *key,uint32 idx,char *pre)

{
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int len;
  uint indent;
  int local_30;
  
  printf("%s%-*.*s",*(undefined8 *)(in_RDI + 0x58),(ulong)(uint)(in_ESI * 2),
         (ulong)(uint)(in_ESI * 2)," ");
  if (in_RDX == 0) {
    if (in_R8 == 0) {
      local_30 = printf("[%u]",(ulong)in_ECX);
    }
    else {
      local_30 = printf("[%s %u]",in_R8,(ulong)in_ECX);
    }
  }
  else {
    local_30 = printf("%s",in_RDX);
  }
  return (*(int *)(in_RDI + 0xc0) + in_ESI * -2) - local_30;
}

Assistant:

int TextOutput::printChildKey(unsigned level, const char* key, uint32 idx, const char* pre) const {
	const unsigned indent = level * 2;
	int len = 0;
	printf("%s%-*.*s", format[cat_comment], indent, indent, " ");
	if      (key) { len = printf("%s", key); }
	else if (pre) { len = printf("[%s %u]", pre, idx); }
	else          { len = printf("[%u]", idx); }
	return (width_ - (int)indent) - len;
}